

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::InitRewards(POMDPX *this)

{
  double dVar1;
  pointer pvVar2;
  pointer ppPVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined4 extraout_var;
  
  if (this->is_small_ != false) {
    iVar4 = (*(this->super_MDP)._vptr_MDP[2])();
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->rewards_,(long)iVar4);
    iVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
    if (0 < iVar4) {
      uVar8 = 0;
      do {
        pvVar2 = (this->rewards_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = (*(this->super_MDP)._vptr_MDP[3])(this);
        std::vector<double,_std::allocator<double>_>::resize(pvVar2 + uVar8,(long)iVar4);
        iVar4 = (*(this->super_MDP)._vptr_MDP[3])(this);
        if (0 < iVar4) {
          uVar10 = 0;
          do {
            *(undefined8 *)
             (*(long *)&(this->rewards_).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar10 * 8) = 0;
            iVar4 = (*(this->super_MDP)._vptr_MDP[4])(this,uVar8 & 0xffffffff,uVar10 & 0xffffffff);
            plVar5 = (long *)CONCAT44(extraout_var,iVar4);
            lVar6 = *plVar5;
            if (plVar5[1] != lVar6) {
              lVar7 = 0x18;
              uVar9 = 0;
              do {
                dVar1 = *(double *)(lVar6 + lVar7);
                ppPVar3 = (this->states_).
                          super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                dVar11 = Parser::GetReward(this->parser_,&ppPVar3[uVar8]->vec_id,
                                           &ppPVar3[*(int *)(lVar6 + -0xc + lVar7)]->vec_id,
                                           (ACT_TYPE)uVar10);
                lVar6 = *(long *)&(this->rewards_).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data;
                *(double *)(lVar6 + uVar10 * 8) = dVar11 * dVar1 + *(double *)(lVar6 + uVar10 * 8);
                uVar9 = uVar9 + 1;
                lVar6 = *plVar5;
                lVar7 = lVar7 + 0x20;
              } while (uVar9 < (ulong)(plVar5[1] - lVar6 >> 5));
            }
            uVar10 = uVar10 + 1;
            iVar4 = (*(this->super_MDP)._vptr_MDP[3])(this);
          } while ((long)uVar10 < (long)iVar4);
        }
        uVar8 = uVar8 + 1;
        iVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
      } while ((long)uVar8 < (long)iVar4);
    }
    return;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x163,"void despot::POMDPX::InitRewards()");
}

Assistant:

void POMDPX::InitRewards() {
	assert(is_small_);

	rewards_.resize(NumStates());

	for (int s = 0; s < NumStates(); s++) {
		rewards_[s].resize(NumActions());
		for (int a = 0; a < NumActions(); a++) {
			rewards_[s][a] = 0.0;
			const vector<State>& transition = TransitionProbability(s, a);
			for (int i = 0; i< transition.size(); i++) {
				const State& next = transition[i];
				rewards_[s][a] += next.weight
					* parser_->GetReward(states_[s]->vec_id,
						states_[next.state_id]->vec_id, a);
			}
		}
	}
}